

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-calcs.c
# Opt level: O2

void calc_inventory(player *p)

{
  wchar_t *pwVar1;
  object **ppoVar2;
  byte bVar3;
  ushort uVar4;
  wchar_t wVar5;
  _Bool _Var6;
  wchar_t wVar7;
  uint uVar8;
  object **p_00;
  void *p_01;
  char *p_02;
  object *poVar9;
  angband_constants *paVar10;
  object **ppoVar11;
  object **ppoVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  object *poVar17;
  wchar_t amt;
  ulong len;
  uint uVar18;
  char *pcVar19;
  ulong uVar20;
  
  wVar5 = p->upkeep->inven_cnt;
  uVar4 = z_info->pack_size;
  wVar7 = pack_slots_used(p);
  iVar16 = (uint)uVar4 - wVar7;
  len = (ulong)((uint)(p->body).count + (uint)z_info->pack_size + (uint)z_info->quiver_size + 1);
  p_00 = (object **)mem_zalloc((ulong)z_info->quiver_size << 3);
  p_01 = mem_zalloc((ulong)z_info->pack_size << 3);
  p_02 = (char *)mem_alloc(len);
  uVar14 = 0;
  ppoVar2 = &p->gear;
  ppoVar11 = ppoVar2;
  while (poVar17 = *ppoVar11, poVar17 != (object *)0x0) {
    if (len == uVar14) {
      __assert_fail("j < n_max",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-calcs.c"
                    ,0x46f,"void calc_inventory(struct player *)");
    }
    _Var6 = object_is_equipped(p->body,poVar17);
    p_02[uVar14] = _Var6;
    uVar14 = uVar14 + 1;
    ppoVar11 = &poVar17->next;
  }
  uVar15 = len;
  if (len < uVar14) {
    uVar15 = uVar14;
  }
  for (; uVar15 != uVar14; uVar14 = uVar14 + 1) {
    p_02[uVar14] = '\0';
  }
  p->upkeep->quiver_cnt = L'\0';
  ppoVar11 = p_00;
  for (uVar14 = 0; uVar14 < z_info->quiver_size; uVar14 = uVar14 + 1) {
    poVar17 = p->upkeep->quiver[uVar14];
    ppoVar12 = ppoVar11;
    if (poVar17 != (object *)0x0) {
      *ppoVar11 = poVar17;
      ppoVar12 = p->upkeep->quiver + uVar14;
    }
    *ppoVar12 = (object *)0x0;
    ppoVar11 = ppoVar11 + 1;
  }
  iVar13 = 0;
  ppoVar11 = ppoVar2;
  pcVar19 = p_02;
  while (poVar17 = *ppoVar11, poVar17 != (object *)0x0) {
    if ((((*pcVar19 == '\0') && (wVar7 = preferred_quiver_slot(poVar17), L'\xffffffff' < wVar7)) &&
        ((uint)wVar7 < (uint)z_info->quiver_size)) &&
       (p->upkeep->quiver[(uint)wVar7] == (object *)0x0)) {
      _Var6 = tval_is_ammo(poVar17);
      uVar18 = 1;
      if (!_Var6) {
        uVar18 = (uint)z_info->thrown_quiver_mult;
      }
      bVar3 = poVar17->number;
      uVar8 = uVar18 * bVar3;
      uVar4 = z_info->quiver_slot_size;
      if (uVar4 < uVar8) {
        amt = (uint)bVar3 - uVar4 / uVar18;
        if ((uint)bVar3 < uVar4 / uVar18 || amt == L'\0') {
          __assert_fail("nsplit < current->number",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-calcs.c"
                        ,0x49c,"void calc_inventory(struct player *)");
        }
        if ((uVar4 < uVar18) || (iVar16 < iVar13)) goto LAB_001aa776;
        poVar9 = object_split(poVar17,amt);
        gear_insert_end(p,poVar9);
        iVar13 = iVar13 + 1;
        uVar8 = uVar18 * poVar17->number;
      }
      p->upkeep->quiver[(uint)wVar7] = poVar17;
      pwVar1 = &p->upkeep->quiver_cnt;
      *pwVar1 = *pwVar1 + uVar8;
      *pcVar19 = '\x01';
    }
LAB_001aa776:
    pcVar19 = pcVar19 + 1;
    ppoVar11 = &poVar17->next;
  }
  paVar10 = z_info;
  for (uVar14 = 0; uVar14 < paVar10->quiver_size; uVar14 = uVar14 + 1) {
    if (p->upkeep->quiver[uVar14] == (object *)0x0) {
      uVar20 = 0;
      poVar17 = (object *)0x0;
      uVar15 = 0xffffffffffffffff;
      ppoVar11 = ppoVar2;
      while (poVar9 = *ppoVar11, poVar9 != (object *)0x0) {
        if (len == uVar20) {
          __assert_fail("j < n_max",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-calcs.c"
                        ,0x4c8,"void calc_inventory(struct player *)");
        }
        if ((p_02[uVar20] == '\0') && (_Var6 = tval_is_ammo(poVar9), _Var6)) {
          if (((ushort)poVar9->number <= z_info->quiver_slot_size) ||
             (z_info->quiver_slot_size != 0 && iVar13 <= iVar16)) {
            _Var6 = earlier_object(poVar17,poVar9,false);
            if (_Var6) {
              poVar17 = poVar9;
            }
            uVar15 = uVar15 & 0xffffffff;
            if (_Var6) {
              uVar15 = uVar20 & 0xffffffff;
            }
          }
        }
        uVar20 = uVar20 + 1;
        ppoVar11 = &poVar9->next;
      }
      if (poVar17 == (object *)0x0) break;
      bVar3 = poVar17->number;
      uVar4 = z_info->quiver_slot_size;
      wVar7 = (uint)bVar3 - (uint)uVar4;
      if ((uint)uVar4 <= (uint)bVar3 && wVar7 != L'\0') {
        if ((uVar4 == 0) || (iVar16 < iVar13)) {
          __assert_fail("z_info->quiver_slot_size > 0 && n_stack_split <= n_pack_remaining",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-calcs.c"
                        ,0x4e6,"void calc_inventory(struct player *)");
        }
        poVar9 = object_split(poVar17,wVar7);
        gear_insert_end(p,poVar9);
        bVar3 = poVar17->number;
      }
      p->upkeep->quiver[uVar14] = poVar17;
      pwVar1 = &p->upkeep->quiver_cnt;
      *pwVar1 = *pwVar1 + (uint)bVar3;
      p_02[(int)uVar15] = '\x01';
      paVar10 = z_info;
    }
  }
  if (character_dungeon != false) {
    for (uVar14 = 0; z_info->quiver_size != uVar14; uVar14 = uVar14 + 1) {
      if ((p_00[uVar14] != (object *)0x0) && (p->upkeep->quiver[uVar14] != p_00[uVar14])) {
        msg("You re-arrange your quiver.");
        break;
      }
    }
  }
  uVar14 = 0;
  while( true ) {
    uVar15 = (ulong)z_info->pack_size;
    if (uVar15 <= uVar14) break;
    *(object **)((long)p_01 + uVar14 * 8) = p->upkeep->inven[uVar14];
    uVar14 = uVar14 + 1;
  }
  p->upkeep->inven_cnt = L'\0';
  for (uVar14 = 0; uVar14 <= uVar15; uVar14 = uVar14 + 1) {
    uVar20 = 0;
    poVar17 = (object *)0x0;
    uVar15 = 0xffffffffffffffff;
    ppoVar11 = ppoVar2;
    while (poVar9 = *ppoVar11, poVar9 != (object *)0x0) {
      if (len == uVar20) {
        __assert_fail("j < n_max",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-calcs.c"
                      ,0x50d,"void calc_inventory(struct player *)");
      }
      if (p_02[uVar20] == '\0') {
        _Var6 = earlier_object(poVar17,poVar9,false);
        if (_Var6) {
          poVar17 = poVar9;
        }
        uVar15 = uVar15 & 0xffffffff;
        if (_Var6) {
          uVar15 = uVar20 & 0xffffffff;
        }
      }
      uVar20 = uVar20 + 1;
      ppoVar11 = &poVar9->next;
    }
    p->upkeep->inven[uVar14] = poVar17;
    if (poVar17 != (object *)0x0) {
      pwVar1 = &p->upkeep->inven_cnt;
      *pwVar1 = *pwVar1 + L'\x01';
      p_02[(int)uVar15] = '\x01';
    }
    uVar15 = (ulong)z_info->pack_size;
  }
  if ((character_dungeon == true) && (p->upkeep->inven_cnt == wVar5)) {
    for (uVar14 = 0; uVar14 < uVar15; uVar14 = uVar14 + 1) {
      poVar17 = *(object **)((long)p_01 + uVar14 * 8);
      if ((poVar17 != (object *)0x0) && (p->upkeep->inven[uVar14] != poVar17)) {
        _Var6 = object_is_equipped(p->body,poVar17);
        if (!_Var6) {
          msg("You re-arrange your pack.");
          break;
        }
        uVar15 = (ulong)z_info->pack_size;
      }
    }
  }
  mem_free(p_02);
  mem_free(p_01);
  mem_free(p_00);
  return;
}

Assistant:

void calc_inventory(struct player *p)
{
	int old_inven_cnt = p->upkeep->inven_cnt;
	int n_stack_split = 0;
	int n_pack_remaining = z_info->pack_size - pack_slots_used(p);
	int n_max = 1 + z_info->pack_size + z_info->quiver_size
		+ p->body.count;
	struct object **old_quiver = mem_zalloc(z_info->quiver_size
		* sizeof(*old_quiver));
	struct object **old_pack = mem_zalloc(z_info->pack_size
		* sizeof(*old_pack));
	bool *assigned = mem_alloc(n_max * sizeof(*assigned));
	struct object *current;
	int i, j;

	/*
	 * Equipped items are already taken care of.  Only the others need
	 * to be tested for assignment to the quiver or pack.
	 */
	for (current = p->gear, j = 0; current; current = current->next, ++j) {
		assert(j < n_max);
		assigned[j] = object_is_equipped(p->body, current);
	}
	for (; j < n_max; ++j) {
		assigned[j] = false;
	}

	/* Prepare to fill the quiver */
	p->upkeep->quiver_cnt = 0;

	/* Copy the current quiver and then leave it empty. */
	for (i = 0; i < z_info->quiver_size; i++) {
		if (p->upkeep->quiver[i]) {
			old_quiver[i] = p->upkeep->quiver[i];
			p->upkeep->quiver[i] = NULL;
		} else {
			old_quiver[i] = NULL;
		}
	}

	/* Fill quiver.  First, allocate inscribed items. */
	for (current = p->gear, j = 0; current; current = current->next, ++j) {
		int prefslot;

		/* Skip already assigned (i.e. equipped) items. */
		if (assigned[j]) continue;

		prefslot  = preferred_quiver_slot(current);
		if (prefslot >= 0 && prefslot < z_info->quiver_size
				&& !p->upkeep->quiver[prefslot]) {
			/*
			 * The preferred slot is empty.  Split the stack if
			 * necessary.  Don't allow splitting if it could
			 * result in overfilling the pack by more than one slot.
			 */
			int mult = tval_is_ammo(current) ?
				1 : z_info->thrown_quiver_mult;
			struct object *to_quiver;

			if (current->number * mult
					<= z_info->quiver_slot_size) {
				to_quiver = current;
			} else {
				int nsplit = z_info->quiver_slot_size / mult;

				assert(nsplit < current->number);
				if (nsplit > 0 && n_stack_split
						<= n_pack_remaining) {
					/*
					 * Split off the portion that goes to
					 * the pack.  Since the stack in the
					 * quiver is earlier in the gear list it
					 * will prefer to remain in the quiver
					 * in future calls to calc_inventory()
					 * and will be the preferred target for
					 * combine_pack().
					 */
					to_quiver = current;
					gear_insert_end(p, object_split(current,
						current->number - nsplit));
					++n_stack_split;
				} else {
					to_quiver = NULL;
				}
			}

			if (to_quiver) {
				p->upkeep->quiver[prefslot] = to_quiver;
				p->upkeep->quiver_cnt += to_quiver->number * mult;

				/* That part of the gear has been dealt with. */
				assigned[j] = true;
			}
		}
	}

	/* Now fill the rest of the slots in order. */
	for (i = 0; i < z_info->quiver_size; ++i) {
		struct object *first = NULL;
		int jfirst = -1;

		/* If the slot is full, move on. */
		if (p->upkeep->quiver[i]) continue;

		/* Find the quiver object that should go there. */
		j = 0;
		current = p->gear;
		while (1) {
			if (!current) break;
			assert(j < n_max);

			/*
			 * Only try to assign if not assigned, ammo, and,
			 * if necessary to split, have room for the split
			 * stacks.
			 */
			if (!assigned[j] && tval_is_ammo(current)
					&& (current->number
					<= z_info->quiver_slot_size
					|| (z_info->quiver_slot_size > 0
					&& n_stack_split
					<= n_pack_remaining))) {
				/* Choose the first in order. */
				if (earlier_object(first, current, false)) {
					first = current;
					jfirst = j;
				}
			}

			current = current->next;
			++j;
		}

		/* Stop looking if there's nothing left in the gear. */
		if (!first) break;

		/* Put the item in the slot, splitting (if needed) to fit. */
		if (first->number > z_info->quiver_slot_size) {
			assert(z_info->quiver_slot_size > 0
				&& n_stack_split <= n_pack_remaining);
			/* As above, split off the portion going to the pack. */
			gear_insert_end(p, object_split(first,
				first->number - z_info->quiver_slot_size));
		}
		p->upkeep->quiver[i] = first;
		p->upkeep->quiver_cnt += first->number;

		/* That part of the gear has been dealt with. */
		assigned[jfirst] = true;
	}

	/* Note reordering */
	if (character_dungeon) {
		for (i = 0; i < z_info->quiver_size; i++) {
			if (old_quiver[i] && p->upkeep->quiver[i] != old_quiver[i]) {
				msg("You re-arrange your quiver.");
				break;
			}
		}
	}

	/* Copy the current pack */
	for (i = 0; i < z_info->pack_size; i++) {
		old_pack[i] = p->upkeep->inven[i];
	}

	/* Prepare to fill the inventory */
	p->upkeep->inven_cnt = 0;

	for (i = 0; i <= z_info->pack_size; i++) {
		struct object *first = NULL;
		int jfirst = -1;

		/* Find the object that should go there. */
		j = 0;
		current = p->gear;
		while (1) {
			if (!current) break;
			assert(j < n_max);

			/* Consider it if it hasn't already been handled. */
			if (!assigned[j]) {
				/* Choose the first in order. */
				if (earlier_object(first, current, false)) {
					first = current;
					jfirst = j;
				}
			}

			current = current->next;
			++j;
		}

		/* Allocate */
		p->upkeep->inven[i] = first;
		if (first) {
			++p->upkeep->inven_cnt;
			assigned[jfirst] = true;
		}
	}

	/* Note reordering */
	if (character_dungeon && p->upkeep->inven_cnt == old_inven_cnt) {
		for (i = 0; i < z_info->pack_size; i++) {
			if (old_pack[i] && p->upkeep->inven[i] != old_pack[i]
					 && !object_is_equipped(p->body, old_pack[i])) {
				msg("You re-arrange your pack.");
				break;
			}
		}
	}

	mem_free(assigned);
	mem_free(old_pack);
	mem_free(old_quiver);
}